

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void build_move16(m68k_info *info,int *data,int *modes)

{
  int iVar1;
  m68k_address_mode mVar2;
  cs_m68k *pcVar3;
  cs_m68k_op *pcVar4;
  long in_RDX;
  long in_RSI;
  int m;
  int d;
  cs_m68k_op *op;
  int i;
  cs_m68k *ext;
  undefined8 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int iVar5;
  m68k_info *in_stack_ffffffffffffffe0;
  
  pcVar3 = build_init_op(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                         in_stack_ffffffffffffffd8,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  for (iVar5 = 0; iVar5 < 2; iVar5 = iVar5 + 1) {
    pcVar4 = pcVar3->operands + iVar5;
    iVar1 = *(int *)(in_RSI + (long)iVar5 * 4);
    mVar2 = *(m68k_address_mode *)(in_RDX + (long)iVar5 * 4);
    pcVar4->type = M68K_OP_MEM;
    if ((mVar2 == M68K_AM_REGI_ADDR_POST_INC) || (mVar2 == M68K_AM_REG_DIRECT_ADDR)) {
      pcVar4->address_mode = mVar2;
      (pcVar4->field_0).reg = iVar1 + M68K_REG_A0;
    }
    else {
      pcVar4->address_mode = mVar2;
      pcVar4->field_0 = (anon_union_8_5_85a7a27f_for_cs_m68k_op_0)(long)iVar1;
    }
  }
  return;
}

Assistant:

static void build_move16(m68k_info *info, int data[2], int modes[2])
{
	cs_m68k* ext = build_init_op(info, M68K_INS_MOVE16, 2, 0);
	int i;

	for (i = 0; i < 2; ++i) {
		cs_m68k_op* op = &ext->operands[i];
		const int d = data[i];
		const int m = modes[i];

		op->type = M68K_OP_MEM;

		if (m == M68K_AM_REGI_ADDR_POST_INC || m == M68K_AM_REG_DIRECT_ADDR) {
			op->address_mode = m;
			op->reg = M68K_REG_A0 + d;
		} else {
			op->address_mode = m;
			op->imm = d;
		}
	}
}